

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O1

void __thiscall kpeg::JPEGEncoder::computeDCT(JPEGEncoder *this)

{
  undefined4 uVar1;
  double dVar2;
  double dVar3;
  size_type sVar4;
  long lVar5;
  string *psVar6;
  Level LVar7;
  uint uVar8;
  Logger *pLVar9;
  ostream *poVar10;
  ulong uVar11;
  Level lvl;
  Level lvl_00;
  Image *this_00;
  long lVar12;
  int c;
  long lVar13;
  long lVar14;
  size_type *psVar15;
  int x;
  ulong uVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float Cv;
  array<std::array<kpeg::FPixel,_8UL>,_8UL> coefficients;
  undefined8 local_3d0;
  float local_3c8;
  ulong local_3c0;
  long *local_3b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b0;
  undefined8 local_3a8;
  ulong local_390;
  long local_388;
  ulong local_380;
  long local_378;
  float local_36c;
  undefined8 local_368;
  float fStack_360;
  float fStack_35c;
  ulong local_350;
  string *local_348;
  long local_340;
  ulong local_338;
  string local_330 [24];
  
  pLVar9 = Logger::get();
  LVar7 = Logger::getLevel(pLVar9);
  if (0 < (int)LVar7) {
    pLVar9 = Logger::get();
    poVar10 = Logger::getStream(pLVar9);
    Logger::levelStr_abi_cxx11_(local_330,(Logger *)0x1,lvl);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_330[0]._M_dataplus._M_p,local_330[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Encoder.cpp",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
    *(uint *)(&poVar10->field_0x18 + (long)poVar10->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar10->field_0x18 + (long)poVar10->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1b4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"Applying Forward DCT on components...",0x25);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
      operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = &this->m_image;
  uVar8 = Image::getHeight(this_00);
  if (7 < uVar8) {
    local_3c0 = 8;
    local_390 = 0;
    do {
      uVar8 = Image::getWidth(this_00);
      if (7 < uVar8) {
        local_380 = 8;
        local_388 = 0;
        local_350 = 0;
        do {
          memset(local_330,0,0x300);
          lVar14 = 0;
          do {
            local_36c = *(float *)(&DAT_00133d30 + (ulong)(lVar14 == 0) * 4);
            local_348 = local_330 + lVar14 * 3;
            local_378 = 0;
            local_340 = lVar14;
            do {
              local_3c8 = 0.0;
              local_3d0 = 0;
              uVar11 = local_390;
              do {
                local_368 = (size_type *)
                            ((double)(((int)uVar11 * 2 + 1) * (int)lVar14) * 3.141592653589793 *
                            0.0625);
                lVar12 = local_388;
                uVar16 = local_350;
                local_338 = uVar11;
                do {
                  local_3a8 = (double)(((int)uVar16 * 2 + 1) * (int)local_378) * 3.141592653589793 *
                              0.0625;
                  lVar13 = 0;
                  do {
                    Image::getFlPixelPtr(this_00);
                    fVar17 = *(float *)(*(long *)(*local_3b8 + uVar11 * 0x18) + lVar12 + lVar13 * 4)
                    ;
                    dVar2 = cos(local_3a8);
                    dVar3 = cos((double)local_368);
                    *(float *)((long)&local_3d0 + lVar13 * 4) =
                         (float)(dVar3 * dVar2 * (double)fVar17 +
                                (double)*(float *)((long)&local_3d0 + lVar13 * 4));
                    if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
                    }
                    lVar14 = local_340;
                    lVar5 = local_378;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                  uVar16 = uVar16 + 1;
                  lVar12 = lVar12 + 0xc;
                } while (uVar16 != local_380);
                uVar11 = local_338 + 1;
              } while (uVar11 != local_3c0);
              fVar17 = *(float *)(&DAT_00133d38 + (ulong)(local_378 == 0) * 4) * local_36c;
              local_368._0_4_ = fVar17 * (float)local_3d0;
              local_368._4_4_ = fVar17 * (float)((ulong)local_3d0 >> 0x20);
              local_3d0 = CONCAT44(local_368._4_4_,(float)local_368);
              fVar18 = fVar17 * local_3c8;
              local_368._0_4_ = (float)local_368 * 100.0;
              local_368._4_4_ = local_368._4_4_ * 100.0;
              fStack_360 = fVar17 * 0.0 * 0.0;
              fStack_35c = fVar17 * 0.0 * 0.0;
              local_3c8 = fVar18;
              fVar17 = roundf((float)local_368);
              local_3a8._0_4_ = fVar17;
              local_3a8._4_4_ = extraout_XMM0_Db;
              fVar17 = roundf(local_368._4_4_);
              psVar6 = local_348;
              auVar19._4_4_ = local_3a8._4_4_;
              auVar19._0_4_ = (float)local_3a8;
              auVar19._8_4_ = local_3a8._4_4_;
              auVar19._12_4_ = extraout_XMM0_Db_00;
              auVar20._8_8_ = auVar19._8_8_;
              auVar20._4_4_ = fVar17;
              auVar20._0_4_ = (float)local_3a8;
              auVar20 = divps(auVar20,_DAT_00133d40);
              *(long *)((long)&local_348->_M_dataplus + lVar5 * 0xc) = auVar20._0_8_;
              fVar17 = roundf(fVar18 * 100.0);
              *(float *)((long)&psVar6->_M_string_length + lVar5 * 0xc) = fVar17 / 100.0;
              local_378 = lVar5 + 1;
            } while (local_378 != 8);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          psVar15 = &local_330[0]._M_string_length;
          local_378 = 8;
          local_3a8 = (double)local_390;
          do {
            lVar12 = 8;
            lVar14 = local_388;
            local_368 = psVar15;
            do {
              uVar1 = *(undefined4 *)&(((string *)(psVar15 + -1))->_M_dataplus)._M_p;
              Image::getFlPixelPtr(this_00);
              uVar11 = (ulong)local_3a8;
              *(undefined4 *)(*(long *)(*local_3b8 + (long)local_3a8 * 0x18) + lVar14) = uVar1;
              if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
              }
              uVar1 = *(undefined4 *)((long)psVar15 + -4);
              Image::getFlPixelPtr(this_00);
              *(undefined4 *)(*(long *)(*local_3b8 + uVar11 * 0x18) + 4 + lVar14) = uVar1;
              if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
              }
              sVar4 = *psVar15;
              Image::getFlPixelPtr(this_00);
              *(int *)(*(long *)(*local_3b8 + uVar11 * 0x18) + 8 + lVar14) = (int)sVar4;
              if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
              }
              psVar15 = (size_type *)((long)psVar15 + 0xc);
              lVar14 = lVar14 + 0xc;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            local_3a8 = (double)((long)local_3a8 + 1);
            psVar15 = local_368 + 0xc;
          } while (local_3a8 != (double)local_3c0);
          uVar11 = local_380 + 8;
          uVar16 = local_380 | 7;
          uVar8 = Image::getWidth(this_00);
          local_350 = local_350 + 8;
          local_388 = local_388 + 0x60;
          local_380 = uVar11;
        } while (uVar16 < uVar8);
      }
      uVar11 = local_3c0 + 8;
      uVar16 = local_3c0 | 7;
      uVar8 = Image::getHeight(this_00);
      local_390 = local_390 + 8;
      local_3c0 = uVar11;
    } while (uVar16 < uVar8);
  }
  pLVar9 = Logger::get();
  LVar7 = Logger::getLevel(pLVar9);
  if (0 < (int)LVar7) {
    pLVar9 = Logger::get();
    poVar10 = Logger::getStream(pLVar9);
    Logger::levelStr_abi_cxx11_(local_330,(Logger *)0x1,lvl_00);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_330[0]._M_dataplus._M_p,local_330[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Encoder.cpp",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
    *(uint *)(&poVar10->field_0x18 + (long)poVar10->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar10->field_0x18 + (long)poVar10->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x1f2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Forward DCT applied [OK]",0x18);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
      operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void kpeg::JPEGEncoder::computeDCT()
    {
        LOG(Logger::Level::INFO) << "Applying Forward DCT on components..." << std::endl;
        
        // Traverse the pixel pointer, 8x8 blocks at a time
        for ( int iy = 0; iy + 8 - 1 < m_image.getHeight(); iy += 8 )
        {
            for ( int ix = 0; ix + 8 - 1 < m_image.getWidth(); ix += 8 )
            {
                std::array<std::array<FPixel, 8>, 8> coefficients;
                
                for ( int v = 0; v < 8; ++v )
                {
                    for ( int u = 0; u < 8; ++u )
                    {
                        float Cu = u == 0 ? 1.0 / std::sqrt(2.f) : 1.f;
                        float Cv = v == 0 ? 1.0 / std::sqrt(2.f) : 1.f;
                        float coeff[3] = { 0.f, 0.f, 0.f };
                        
                        for ( int y = iy; y < iy + 8; ++y )
                        {
                            for ( int x = ix; x < ix + 8; ++x )
                            {
                                for ( int c = 0; c < 3; ++c )
                                {
                                    coeff[c] += (*m_image.getFlPixelPtr())[y][x].comp[c] *
                                                 std::cos( ( 2 * x + 1 ) * u * M_PI / 16 ) *
                                                  std::cos( ( 2 * y + 1 ) * v * M_PI / 16 );
                                }
                            }
                        }
                        
                        coeff[YCbCrComponents::Y] = 0.25f * Cu * Cv * coeff[0];
                        coeff[YCbCrComponents::Cb] = 0.25f * Cu * Cv * coeff[1];
                        coeff[YCbCrComponents::Cr] = 0.25f * Cu * Cv * coeff[2];
                        
                        coefficients[v][u].comp[YCbCrComponents::Y] = std::roundf( coeff[YCbCrComponents::Y] * 100 ) / 100;
                        coefficients[v][u].comp[YCbCrComponents::Cb] = std::roundf( coeff[YCbCrComponents::Cb] * 100 ) / 100;
                        coefficients[v][u].comp[YCbCrComponents::Cr] = std::roundf( coeff[YCbCrComponents::Cr] * 100 ) / 100;
                    }
                }
                
                for ( int y = iy; y < iy + 8; ++y )
                {
                    for ( int x = ix; x < ix + 8; ++x )
                    {
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Y] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Y];
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cb] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Cb];
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cr] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Cr];
                    }
                }
            }
        }
        
//         for ( auto&& row : *m_image.getFlPixelPtr() )
//         {
//             for ( auto&& val : row )
//             {
//                 std::cout << val.comp[0] << "," << val.comp[1] << "," << val.comp[2] << "\t";
//             }
//             std::cout << std::endl;
//         }
//         std::cout << std::endl;
        
        LOG(Logger::Level::INFO) << "Forward DCT applied [OK]" << std::endl;
    }